

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O3

bool __thiscall
Assimp::BVHLoader::CanRead(BVHLoader *this,string *pFile,IOSystem *pIOHandler,bool cs)

{
  bool bVar1;
  int iVar2;
  string extension;
  char *tokens [1];
  string local_48;
  char *local_28;
  
  BaseImporter::GetExtension(&local_48,pFile);
  iVar2 = std::__cxx11::string::compare((char *)&local_48);
  if (iVar2 == 0) {
    bVar1 = true;
    goto LAB_00401df7;
  }
  if (local_48._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_00401dc6;
  }
  else if (pIOHandler != (IOSystem *)0x0 && cs) {
LAB_00401dc6:
    local_28 = "HIERARCHY";
    bVar1 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,&local_28,1,200,false,false);
    goto LAB_00401df7;
  }
  bVar1 = false;
LAB_00401df7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool BVHLoader::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool cs) const
{
    // check file extension
    const std::string extension = GetExtension(pFile);

    if( extension == "bvh")
        return true;

    if ((!extension.length() || cs) && pIOHandler) {
        const char* tokens[] = {"HIERARCHY"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}